

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_update.cpp
# Opt level: O2

unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true> __thiscall
duckdb::Transformer::TransformUpdateSetInfo
          (Transformer *this,PGList *target_list,PGNode *where_clause)

{
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> _Var1
  ;
  undefined8 uVar2;
  pointer pUVar3;
  PGResTarget *pPVar4;
  pointer *__ptr;
  optional_ptr<duckdb_libpgquery::PGResTarget,_true> target;
  undefined1 local_48 [24];
  
  make_uniq<duckdb::UpdateSetInfo>();
  while (where_clause = *(PGNode **)(where_clause + 2), where_clause != (PGNode *)0x0) {
    local_48._0_8_ = *(undefined8 *)where_clause;
    pUVar3 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
             operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                         *)this);
    pPVar4 = optional_ptr<duckdb_libpgquery::PGResTarget,_true>::operator->
                       ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)local_48);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pUVar3->columns
               ,&pPVar4->name);
    pUVar3 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
             operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                         *)this);
    optional_ptr<duckdb_libpgquery::PGResTarget,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)local_48);
    TransformExpression((Transformer *)(local_48 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)target_list);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pUVar3->expressions,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_48 + 8));
    if ((ParserOptions *)local_48._8_8_ != (ParserOptions *)0x0) {
      (**(code **)(*(long *)(bool *)local_48._8_8_ + 8))();
    }
  }
  TransformExpression((Transformer *)local_48,
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)target_list);
  pUVar3 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
           operator->((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                       *)this);
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (Transformer *)0x0;
  _Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (pUVar3->condition).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>;
  (pUVar3->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)uVar2;
  if (_Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                          _M_head_impl + 8))();
  }
  if ((Transformer *)local_48._0_8_ != (Transformer *)0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_48._0_8_)->ptr->options)();
  }
  return (unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>)
         (unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>)this;
}

Assistant:

unique_ptr<UpdateSetInfo> Transformer::TransformUpdateSetInfo(duckdb_libpgquery::PGList *target_list,
                                                              duckdb_libpgquery::PGNode *where_clause) {
	auto result = make_uniq<UpdateSetInfo>();
	auto root = target_list;

	for (auto cell = root->head; cell != nullptr; cell = cell->next) {
		auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(cell->data.ptr_value);
		result->columns.emplace_back(target->name);
		result->expressions.push_back(TransformExpression(target->val));
	}

	result->condition = TransformExpression(where_clause);
	return result;
}